

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O0

void google::protobuf::compiler::cpp::anon_unknown_3::InitMethodVariables
               (MethodDescriptor *method,Options *options,Formatter *format)

{
  Formatter *pFVar1;
  string *value;
  Descriptor *pDVar2;
  Options *in_RCX;
  string local_e8;
  allocator local_c1;
  string local_c0;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  Formatter *local_20;
  Formatter *format_local;
  Options *options_local;
  MethodDescriptor *method_local;
  
  local_20 = format;
  format_local = (Formatter *)options;
  options_local = (Options *)method;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"name",&local_41);
  value = MethodDescriptor::name_abi_cxx11_((MethodDescriptor *)options_local);
  Formatter::Set<std::__cxx11::string>(format,&local_40,value);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pFVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"input_type",&local_79);
  pDVar2 = MethodDescriptor::input_type((MethodDescriptor *)options_local);
  QualifiedClassName_abi_cxx11_(&local_a0,(cpp *)pDVar2,(Descriptor *)format_local,in_RCX);
  Formatter::Set<std::__cxx11::string>(pFVar1,&local_78,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  pFVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"output_type",&local_c1);
  pDVar2 = MethodDescriptor::output_type((MethodDescriptor *)options_local);
  QualifiedClassName_abi_cxx11_(&local_e8,(cpp *)pDVar2,(Descriptor *)format_local,in_RCX);
  Formatter::Set<std::__cxx11::string>(pFVar1,&local_c0,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  return;
}

Assistant:

void InitMethodVariables(const MethodDescriptor* method, const Options& options,
                         Formatter* format) {
  format->Set("name", method->name());
  format->Set("input_type", QualifiedClassName(method->input_type(), options));
  format->Set("output_type",
              QualifiedClassName(method->output_type(), options));
}